

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void testNetBios(void)

{
  char buffer2 [1024];
  
  puts("CKAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA");
  memset(buffer2,0,0x400);
  decodeNetBiosName(buffer2,"CKAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA",0x20);
  puts(buffer2);
  return;
}

Assistant:

void
testNetBios() {
	const char* name = "*";

	char buffer[1024] = "CKAAAAAAA" "AAAAAAAAAAAAAAAA" "AAAAAAA"; //{ 0 };
	size_t length = 32; //encodeNetBiosName (buffer, name);
	printf("%s\n", buffer);

	char buffer2[1024] = { 0 };
	decodeNetBiosName(buffer2, buffer, length);
	printf("%s\n", buffer2);
}